

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O0

int Scl_LibertySkipSpaces(Scl_Tree_t *p,char **ppPos,char *pEnd,int fStopAtNewLine)

{
  int iVar1;
  char *local_30;
  char *pPos;
  int fStopAtNewLine_local;
  char *pEnd_local;
  char **ppPos_local;
  Scl_Tree_t *p_local;
  
  local_30 = *ppPos;
  while ((local_30 < pEnd &&
         (((*local_30 != '\n' || (p->nLines = p->nLines + 1, fStopAtNewLine == 0)) &&
          (iVar1 = Scl_LibertyCharIsSpace(*local_30), iVar1 != 0))))) {
    local_30 = local_30 + 1;
  }
  *ppPos = local_30;
  return (int)(local_30 == pEnd);
}

Assistant:

static inline int Scl_LibertySkipSpaces( Scl_Tree_t * p, char ** ppPos, char * pEnd, int fStopAtNewLine )
{
    char * pPos = *ppPos;
    for ( ; pPos < pEnd; pPos++ )
    {
        if ( *pPos == '\n' )
        {
            p->nLines++;
            if ( fStopAtNewLine )
                break;
        }        
        if ( !Scl_LibertyCharIsSpace(*pPos) )
            break;
    }
    *ppPos = pPos;
    return pPos == pEnd;
}